

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::ReadPropertyIdOfFormals
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  Type pBVar1;
  code *pcVar2;
  bool bVar3;
  Type TVar4;
  byte *pbVar5;
  PropertyIdArray *pPVar6;
  undefined4 *puVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint32 local_40;
  bool local_3b;
  bool local_3a;
  bool local_39;
  uint32 count;
  bool hadDuplicates;
  bool has__proto__;
  bool hasNonSimpleParams;
  int id;
  byte extraSlotCount;
  
  local_40 = 0;
  pbVar5 = ReadInt32(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                     (int *)&local_40);
  hasNonSimpleParams = false;
  pbVar5 = ReadByte(pbVar5,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar5)),
                    &hasNonSimpleParams);
  pPVar6 = FunctionBody::AllocatePropertyIdArrayForFormals
                     (function,(local_40 + hasNonSimpleParams) * 4,local_40,hasNonSimpleParams);
  pPVar6->count = local_40;
  local_3b = false;
  pbVar5 = ReadBool(this,pbVar5,&local_3b);
  pPVar6->hadDuplicates = local_3b;
  local_3a = false;
  pbVar5 = ReadBool(this,pbVar5,&local_3a);
  pPVar6->has__proto__ = local_3a;
  local_39 = false;
  pbVar5 = ReadBool(this,pbVar5,&local_39);
  pPVar6->hasNonSimpleParams = local_39;
  count = 0;
  if (pPVar6->count != 0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar10 = 0;
    do {
      pbVar5 = ReadInt32(pbVar5,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar5)),
                         (int *)&count);
      pBVar1 = function->byteCodeCache;
      iVar8 = count - pBVar1->builtInPropertyCount;
      TVar4 = count;
      if (count != 0xffffffff && pBVar1->builtInPropertyCount <= (int)count) {
        if (pBVar1->propertyCount <= iVar8) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x99,"(realOffset<propertyCount)","realOffset<propertyCount")
          ;
          if (!bVar3) goto LAB_00893f55;
          *puVar7 = 0;
        }
        if (pBVar1->propertyIds[iVar8] == -1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x9a,"(propertyIds[realOffset]!=-1)",
                                      "propertyIds[realOffset]!=-1");
          if (!bVar3) {
LAB_00893f55:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
        TVar4 = pBVar1->propertyIds[iVar8];
      }
      (&pPVar6[1].count)[uVar10] = TVar4;
      uVar10 = uVar10 + 1;
    } while (uVar10 < pPVar6->count);
  }
  if (hasNonSimpleParams != false) {
    uVar9 = 0;
    do {
      pbVar5 = ReadInt32(pbVar5,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar5)),
                         (int *)&count);
      (&pPVar6[1].count)[pPVar6->count + uVar9] = count;
      uVar9 = uVar9 + 1;
    } while (uVar9 < hasNonSimpleParams);
  }
  return pbVar5;
}

Assistant:

const byte * ReadPropertyIdOfFormals(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant = 0;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfPropIdsOfFormals);
#endif

        uint32 count = 0;
        current = ReadUInt32(current, &count);

        byte extraSlotCount = 0;
        current = ReadByte(current, &extraSlotCount);

        PropertyIdArray * propIds = function->AllocatePropertyIdArrayForFormals((extraSlotCount + count) * sizeof(PropertyId), count, extraSlotCount);
        propIds->count = count;

        bool hadDuplicates = false;
        current = ReadBool(current, &hadDuplicates);
        propIds->hadDuplicates = hadDuplicates;

        bool has__proto__ = false;
        current = ReadBool(current, &has__proto__);
        propIds->has__proto__ = has__proto__;

        bool hasNonSimpleParams = false;
        current = ReadBool(current, &hasNonSimpleParams);
        propIds->hasNonSimpleParams = hasNonSimpleParams;

        int id = 0;
        for (uint i = 0; i < propIds->count; ++i)
        {
            current = ReadInt32(current, &id);
            PropertyId propertyId = function->GetByteCodeCache()->LookupPropertyId(id);
            propIds->elements[i] = propertyId;
        }

        for (int i = 0; i < extraSlotCount; ++i)
        {
            current = ReadInt32(current, &id);
            propIds->elements[propIds->count + i] = id;
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfPropIdsOfFormals);
#endif

        return current;
    }